

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** getgclist(GCObject *o)

{
  long lStack_8;
  
  switch(o->tt) {
  case '\x05':
    lStack_8 = 0x30;
    break;
  case '\a':
switchD_001190ed_caseD_2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x85,"GCObject **getgclist(GCObject *)");
  case '\b':
    lStack_8 = 0x48;
    break;
  case '\t':
    lStack_8 = 0x70;
    break;
  default:
    if (o->tt != '&') goto switchD_001190ed_caseD_2;
  case '\x06':
    lStack_8 = 0x10;
  }
  return (GCObject **)((long)&o->next + lStack_8);
}

Assistant:

static GCObject **getgclist (GCObject *o) {
  switch (o->tt) {
    case LUA_TTABLE: return &gco2t(o)->gclist;
    case LUA_TLCL: return &gco2lcl(o)->gclist;
    case LUA_TCCL: return &gco2ccl(o)->gclist;
    case LUA_TTHREAD: return &gco2th(o)->gclist;
    case LUA_TPROTO: return &gco2p(o)->gclist;
    default: lua_assert(0); return 0;
  }
}